

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

size_t __thiscall Parsing::File::getLength(File *this,string *s)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  size_t local_30;
  size_t n;
  size_t p;
  string *s_local;
  File *this_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)s,0x112231);
  sVar2 = lVar1 + 1;
  local_30 = sVar2;
  while( true ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == '\0') {
      return sVar2;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == '.') break;
    local_30 = local_30 + 1;
  }
  return local_30 - sVar2;
}

Assistant:

size_t File::getLength(std::string &s) const
    {
        size_t p = s.find_last_of("/") + 1;

        for (size_t n = p; s[n]; n++)
            if (s[n] == '.')
                return n - p;
        return p;
    }